

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_estimator.c
# Opt level: O1

int16_t WebRtcIsac_UpdateUplinkJitter(BwEstimatorstr *bwest_str,int32_t index)

{
  int16_t iVar1;
  
  if ((bwest_str->external_bw_info).in_use == 0) {
    iVar1 = -0x1860;
    if ((uint)index < 0x18) {
      bwest_str->send_max_delay_avg =
           bwest_str->send_max_delay_avg * 0.9 + *(float *)(&DAT_0019fe98 + (ulong)(index == 0) * 4)
      ;
      iVar1 = 0;
    }
    return iVar1;
  }
  __assert_fail("!bwest_str->external_bw_info.in_use",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/main/source/bandwidth_estimator.c"
                ,0x23f,"int16_t WebRtcIsac_UpdateUplinkJitter(BwEstimatorstr *, int32_t)");
}

Assistant:

int16_t WebRtcIsac_UpdateUplinkJitter(
    BwEstimatorstr*              bwest_str,
    int32_t                  index)
{
  assert(!bwest_str->external_bw_info.in_use);

  if((index < 0) || (index > 23))
  {
    return -ISAC_RANGE_ERROR_BW_ESTIMATOR;
  }

  if(index > 0)
  {
    /* compute the jitter estimate as decoded on the other side */
    bwest_str->send_max_delay_avg = 0.9f * bwest_str->send_max_delay_avg +
        0.1f * (float)MAX_ISAC_MD;
  }
  else
  {
    /* compute the jitter estimate as decoded on the other side */
    bwest_str->send_max_delay_avg = 0.9f * bwest_str->send_max_delay_avg +
        0.1f * (float)MIN_ISAC_MD;
  }

  return 0;
}